

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::ConfidentialTxOut::ConfidentialTxOut
          (ConfidentialTxOut *this,Script *locking_script,ConfidentialAssetId *asset,
          ConfidentialValue *confidential_value)

{
  Amount AVar1;
  Amount local_38;
  ConfidentialValue *local_28;
  ConfidentialValue *confidential_value_local;
  ConfidentialAssetId *asset_local;
  Script *locking_script_local;
  ConfidentialTxOut *this_local;
  
  local_28 = confidential_value;
  confidential_value_local = (ConfidentialValue *)asset;
  asset_local = (ConfidentialAssetId *)locking_script;
  locking_script_local = (Script *)this;
  AVar1 = Amount::CreateBySatoshiAmount(0);
  local_38.amount_ = AVar1.amount_;
  local_38.ignore_check_ = AVar1.ignore_check_;
  AbstractTxOut::AbstractTxOut(&this->super_AbstractTxOut,&local_38,(Script *)asset_local);
  (this->super_AbstractTxOut)._vptr_AbstractTxOut = (_func_int **)&PTR__ConfidentialTxOut_003ebfc8;
  ConfidentialAssetId::ConfidentialAssetId
            (&this->asset_,(ConfidentialAssetId *)confidential_value_local);
  ConfidentialValue::ConfidentialValue(&this->confidential_value_,local_28);
  ConfidentialNonce::ConfidentialNonce(&this->nonce_);
  ByteData::ByteData(&this->surjection_proof_);
  ByteData::ByteData(&this->range_proof_);
  return;
}

Assistant:

ConfidentialTxOut::ConfidentialTxOut(
    const Script &locking_script, const ConfidentialAssetId &asset,
    const ConfidentialValue &confidential_value)
    : AbstractTxOut(Amount::CreateBySatoshiAmount(0), locking_script),
      asset_(asset),
      confidential_value_(confidential_value),
      nonce_(),
      surjection_proof_(),
      range_proof_() {
  // do nothing
}